

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

SmallVector<diligent_spirv_cross::Instruction,_8UL> * __thiscall
diligent_spirv_cross::SmallVector<diligent_spirv_cross::Instruction,_8UL>::operator=
          (SmallVector<diligent_spirv_cross::Instruction,_8UL> *this,
          SmallVector<diligent_spirv_cross::Instruction,_8UL> *other)

{
  ulong uVar1;
  Instruction *pIVar2;
  Instruction *pIVar3;
  long lVar4;
  size_t i;
  ulong uVar5;
  
  if (this != other) {
    (this->super_VectorView<diligent_spirv_cross::Instruction>).buffer_size = 0;
    reserve(this,(other->super_VectorView<diligent_spirv_cross::Instruction>).buffer_size);
    lVar4 = 0;
    for (uVar5 = 0; uVar1 = (other->super_VectorView<diligent_spirv_cross::Instruction>).buffer_size
        , uVar5 < uVar1; uVar5 = uVar5 + 1) {
      pIVar2 = (this->super_VectorView<diligent_spirv_cross::Instruction>).ptr;
      pIVar3 = (other->super_VectorView<diligent_spirv_cross::Instruction>).ptr;
      *(undefined4 *)((long)&pIVar2->length + lVar4) =
           *(undefined4 *)((long)&pIVar3->length + lVar4);
      *(undefined8 *)((long)&pIVar2->op + lVar4) = *(undefined8 *)((long)&pIVar3->op + lVar4);
      lVar4 = lVar4 + 0xc;
    }
    (this->super_VectorView<diligent_spirv_cross::Instruction>).buffer_size = uVar1;
  }
  return this;
}

Assistant:

SmallVector &operator=(const SmallVector &other) SPIRV_CROSS_NOEXCEPT
	{
		if (this == &other)
			return *this;

		clear();
		reserve(other.buffer_size);
		for (size_t i = 0; i < other.buffer_size; i++)
			new (&this->ptr[i]) T(other.ptr[i]);
		this->buffer_size = other.buffer_size;
		return *this;
	}